

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O2

void Abc_NtkTestTimCollectCone_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  uint uVar4;
  void **ppvVar5;
  int Fill;
  long lVar6;
  
  iVar3 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar3 == 0) {
    pAVar2 = pObj->pNtk;
    iVar3 = pAVar2->nTravIds;
    iVar1 = pObj->Id;
    Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar2->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar2->vTravIds).pArray[iVar1] = iVar3;
    uVar4 = *(uint *)&pObj->field_0x14 & 0xf;
    if ((uVar4 != 2) && (uVar4 != 5)) {
      if (uVar4 != 7) {
        __assert_fail("Abc_ObjIsNode( pObj )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                      ,0xc9,"void Abc_NtkTestTimCollectCone_rec(Abc_Obj_t *, Vec_Ptr_t *)");
      }
      for (lVar6 = 0; lVar6 < (pObj->vFanins).nSize; lVar6 = lVar6 + 1) {
        Abc_NtkTestTimCollectCone_rec
                  ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]],vNodes);
      }
      iVar3 = vNodes->nSize;
      if (iVar3 == vNodes->nCap) {
        uVar4 = 0x10;
        if (0xf < iVar3) {
          uVar4 = iVar3 * 2;
        }
        if (iVar3 < (int)uVar4) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar4 << 3);
          }
          else {
            ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar4 << 3);
            iVar3 = vNodes->nSize;
          }
          vNodes->pArray = ppvVar5;
          vNodes->nCap = uVar4;
        }
      }
      vNodes->nSize = iVar3 + 1;
      vNodes->pArray[iVar3] = pObj;
    }
  }
  return;
}

Assistant:

void Abc_NtkTestTimCollectCone_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode( pObj ) );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NtkTestTimCollectCone_rec( pFanin, vNodes );
    Vec_PtrPush( vNodes, pObj );
}